

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> * __thiscall
pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>::
def_static<std::shared_ptr<anurbs::Model>(*)(std::__cxx11::string_const&)>
          (class_<anurbs::Model,std::shared_ptr<anurbs::Model>> *this,char *name_,
          _func_shared_ptr<anurbs::Model>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          **f)

{
  _func_shared_ptr<anurbs::Model>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
  *f_00;
  cpp_function cf;
  handle local_58;
  handle local_50;
  cpp_function local_48;
  handle local_40;
  object local_38;
  char *local_30 [4];
  
  f_00 = *f;
  local_58.m_ptr = *(PyObject **)this;
  local_38.super_handle.m_ptr = (handle)&_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_30[0] = name_;
  getattr((pybind11 *)&local_40,local_58,name_,(PyObject *)&_Py_NoneStruct);
  local_50.m_ptr = local_40.m_ptr;
  cpp_function::
  cpp_function<std::shared_ptr<anurbs::Model>,std::__cxx11::string_const&,pybind11::name,pybind11::scope,pybind11::sibling>
            (&local_48,f_00,(name *)local_30,(scope *)&local_58,(sibling *)&local_50);
  pybind11::object::~object((object *)&local_40);
  pybind11::object::~object(&local_38);
  staticmethod::staticmethod((staticmethod *)&local_58,(object *)&local_48);
  cpp_function::name((cpp_function *)&local_50);
  detail::object_api<pybind11::handle>::attr
            ((obj_attr_accessor *)local_30,(object_api<pybind11::handle> *)this,local_50);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::operator=
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_30,
             (staticmethod *)&local_58);
  detail::accessor<pybind11::detail::accessor_policies::obj_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::obj_attr> *)local_30);
  pybind11::object::~object((object *)&local_50);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object((object *)&local_48);
  return (class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *)this;
}

Assistant:

class_ &
    def_static(const char *name_, Func &&f, const Extra&... extra) {
        static_assert(!std::is_member_function_pointer<Func>::value,
                "def_static(...) called with a non-static member function pointer");
        cpp_function cf(std::forward<Func>(f), name(name_), scope(*this),
                        sibling(getattr(*this, name_, none())), extra...);
        attr(cf.name()) = staticmethod(cf);
        return *this;
    }